

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

kp_error_t list_dir(kp_ctx *ctx,char *root,char *indent,_Bool print_path)

{
  int iVar1;
  char **ppcVar2;
  kp_error_t kVar3;
  kp_error_t extraout_EAX;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  size_t __nmemb;
  long lVar7;
  int nsafes;
  char **safes;
  int local_3c;
  char **local_38;
  
  local_38 = (char **)0x0;
  local_3c = 0;
  local_38 = (char **)calloc(0,8);
  kVar3 = list_dir_r(&local_38,&local_3c,root);
  ppcVar2 = local_38;
  iVar1 = local_3c;
  if (kVar3 == 0) {
    __nmemb = (size_t)local_3c;
    qsort(local_38,__nmemb,8,path_sort);
    if (print_path) {
      sVar4 = strlen(ctx->ws_path);
      __printf_chk(1,"%s/\n",root + sVar4 + 1);
    }
    sVar4 = strlen(root);
    if (0 < iVar1) {
      sVar6 = 0;
      do {
        __printf_chk(1,"%s%s\n",indent,ppcVar2[sVar6] + sVar4 + 1);
        sVar6 = sVar6 + 1;
      } while (__nmemb != sVar6);
    }
  }
  ppcVar2 = local_38;
  lVar5 = (long)local_3c;
  if (0 < lVar5) {
    lVar7 = 0;
    do {
      free(ppcVar2[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar5 != lVar7);
  }
  free(local_38);
  return extraout_EAX;
}

Assistant:

static kp_error_t
list_dir(struct kp_ctx *ctx, char *root, char *indent, bool print_path)
{
	kp_error_t ret;
	char **safes = NULL;
	int nsafes = 0, i = 0;
	size_t ignore;

	safes = calloc(nsafes, sizeof(char *));

	if ((ret = list_dir_r(&safes, &nsafes, root)) != KP_SUCCESS) {
		goto out;
	}

	qsort(safes, nsafes, sizeof(char *), path_sort);

	if (print_path) {
		printf("%s/\n", root + strlen(ctx->ws_path) + 1);
	}
	ignore = strlen(root) + 1;
	for (i = 0; i < nsafes; i++) {
		printf("%s%s\n", indent, safes[i] + ignore);
	}

out:
	for (i = 0; i < nsafes; i++) {
		free(safes[i]);
	}
	free(safes);

	return ret;
}